

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void __thiscall Matrix<double>::reshape(Matrix<double> *this,Shape *shape)

{
  uint uVar1;
  bool bVar2;
  reference this_00;
  vector<double,_std::allocator<double>_> *vec;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  Shape *shape_local;
  Matrix<double> *this_local;
  
  bVar2 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::empty(&this->m_elems);
  if (!bVar2) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::clear(&this->m_elems);
  }
  uVar1 = shape->n_col;
  (this->m_shape).n_row = shape->n_row;
  (this->m_shape).n_col = uVar1;
  (this->m_shape).is_diogonal = shape->is_diogonal;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->m_elems,(ulong)shape->n_row);
  if (shape->n_col != 0) {
    __end0 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::begin(&this->m_elems);
    vec = (vector<double,_std::allocator<double>_> *)
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::end(&this->m_elems);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                       *)&vec), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                ::operator*(&__end0);
      std::vector<double,_std::allocator<double>_>::resize(this_00,(ulong)shape->n_col);
      __gnu_cxx::
      __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator++(&__end0);
    }
  }
  return;
}

Assistant:

void Matrix<T>::reshape(const Shape& shape){
    if(!m_elems.empty()) m_elems.clear();
    m_shape=shape;

    m_elems.resize(shape.n_row);
    if(shape.n_col){
        for(auto& vec: m_elems)
            vec.resize(shape.n_col);
    }
}